

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O1

XMLNode __thiscall XMLParser::XMLNode::getChildNode(XMLNode *this,char *name,int j)

{
  long lVar1;
  int iVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  int *j_00;
  int iVar3;
  int iVar4;
  XMLNode *A;
  long lVar5;
  bool bVar6;
  int i;
  XMLNode local_38;
  
  j_00 = (int *)CONCAT44(in_register_00000014,j);
  lVar1 = *(long *)name;
  if (lVar1 != 0) {
    if (-1 < in_ECX) {
      if (in_ECX != 0) {
        iVar3 = in_ECX + 1;
        do {
          getChildNode(&local_38,name,j_00);
          ~XMLNode(&local_38);
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
      }
      getChildNode(this,name,j_00);
      return (XMLNode)(XMLNodeData *)this;
    }
    iVar3 = *(int *)(lVar1 + 8);
    lVar5 = (long)iVar3;
    iVar4 = -1;
    do {
      bVar6 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar6) {
        iVar4 = 0;
        lVar5 = -1;
        goto LAB_0019b4ed;
      }
      iVar2 = strcasecmp((char *)j_00,(char *)**(undefined8 **)(*(long *)(lVar1 + 0x28) + lVar5 * 8)
                        );
      iVar4 = iVar4 + 1;
    } while (iVar2 != 0);
    iVar4 = iVar3 - iVar4;
LAB_0019b4ed:
    if ((0 < iVar4) && (iVar4 <= iVar3)) {
      A = (XMLNode *)((long)(int)lVar5 * 8 + *(long *)(lVar1 + 0x28));
      goto LAB_0019b4fd;
    }
  }
  A = (XMLNode *)&emptyXMLNode;
LAB_0019b4fd:
  XMLNode(this,A);
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::getChildNode(XMLCSTR name, int j) const
    {
        if(!d)
            return emptyXMLNode;
        if(j >= 0)
        {
            int i = 0;
            while(j-- > 0)
                getChildNode(name, &i);
            return getChildNode(name, &i);
        }
        int i = d->nChild;
        while(i--)
            if(!xstricmp(name, d->pChild[i].d->lpszName))
                break;
        if(i < 0)
            return emptyXMLNode;
        return getChildNode(i);
    }